

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm.c
# Opt level: O1

void usage(void)

{
  long lVar1;
  
  fwrite("LuaJIT 2.1.0-beta3 VM builder.\n",0x1f,1,_stderr);
  fwrite("Copyright (C) 2005-2021 Mike Pall, https://luajit.org/\n",0x37,1,_stderr);
  fwrite("Target architecture: x64\n\n",0x1a,1,_stderr);
  fwrite("Usage: buildvm -m mode [-o outfile] [infiles...]\n\n",0x32,1,_stderr);
  fwrite("Available modes:\n",0x11,1,_stderr);
  lVar1 = 0;
  do {
    fprintf(_stderr,"  %s\n",*(undefined8 *)((long)modenames + lVar1));
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x58);
  exit(1);
}

Assistant:

static void usage(void)
{
  int i;
  fprintf(stderr, LUAJIT_VERSION " VM builder.\n");
  fprintf(stderr, LUAJIT_COPYRIGHT ", " LUAJIT_URL "\n");
  fprintf(stderr, "Target architecture: " LJ_ARCH_NAME "\n\n");
  fprintf(stderr, "Usage: buildvm -m mode [-o outfile] [infiles...]\n\n");
  fprintf(stderr, "Available modes:\n");
  for (i = 0; i < BUILD__MAX; i++)
    fprintf(stderr, "  %s\n", modenames[i]);
  exit(1);
}